

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O2

int unicode_case1(CharRange *cr,int case_mask)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint *puVar4;
  uint uVar5;
  uint32_t c2;
  uint uVar6;
  uint c1;
  uint32_t uVar7;
  bool bVar8;
  bool bVar9;
  uint local_34;
  
  if (case_mask == 0) {
    return 0;
  }
  puVar4 = &DAT_00174340;
  uVar6 = 0;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    if (((uint)case_mask >> ((uint)lVar3 & 0x1f) & 1) != 0) {
      uVar6 = uVar6 | *puVar4;
    }
    puVar4 = puVar4 + 1;
  }
  bVar8 = (case_mask & 1U) != 0;
  local_34 = case_mask & 1;
  bVar9 = (case_mask & 6U) != 0;
  lVar3 = 0;
  do {
    if (lVar3 == 0x169) {
      return 0;
    }
    uVar5 = case_conv_table1[lVar3];
    uVar1 = uVar5 >> 4 & 0xf;
    if ((uVar6 >> uVar1 & 1) != 0) {
      c1 = uVar5 >> 0xf;
      uVar5 = uVar5 >> 8 & 0x7f;
      if (uVar1 == 5) {
        if (bVar9 && bVar8) goto LAB_0016268e;
        if ((local_34 == 0) && (iVar2 = cr_add_interval(cr,c1,c1 + 1), iVar2 != 0)) {
          return -1;
        }
        uVar7 = c1 + 2;
        iVar2 = cr_add_interval(cr,c1 + 1,uVar7);
        if (iVar2 != 0) {
          return -1;
        }
        if (local_34 == 0) goto LAB_001626a2;
        c2 = c1 + 3;
      }
      else {
        if ((uVar1 == 4) && (!bVar9 || !bVar8)) {
          uVar7 = c1 + local_34;
          uVar1 = 0;
          while (uVar1 < uVar5) {
            iVar2 = cr_add_interval(cr,uVar7,uVar7 + 1);
            uVar1 = uVar1 + 2;
            uVar7 = uVar7 + 2;
            if (iVar2 != 0) {
              return -1;
            }
          }
          goto LAB_001626a2;
        }
LAB_0016268e:
        c2 = uVar5 + c1;
        uVar7 = c1;
      }
      iVar2 = cr_add_interval(cr,uVar7,c2);
      if (iVar2 != 0) {
        return -1;
      }
    }
LAB_001626a2:
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static int unicode_case1(CharRange *cr, int case_mask)
{
#define MR(x) (1 << RUN_TYPE_ ## x)
    const uint32_t tab_run_mask[3] = {
        MR(U) | MR(UF) | MR(UL) | MR(LSU) | MR(U2L_399_EXT2) | MR(UF_D20) |
        MR(UF_D1_EXT) | MR(U_EXT) | MR(U_EXT2) | MR(U_EXT3),

        MR(L) | MR(LF) | MR(UL) | MR(LSU) | MR(U2L_399_EXT2) | MR(LF_EXT) | MR(L_EXT2),

        MR(UF) | MR(LF) | MR(UL) | MR(LSU) | MR(U2L_399_EXT2) | MR(LF_EXT) | MR(UF_D20) | MR(UF_D1_EXT) | MR(LF_EXT),
    };
#undef MR
    uint32_t mask, v, code, type, len, i, idx;

    if (case_mask == 0)
        return 0;
    mask = 0;
    for(i = 0; i < 3; i++) {
        if ((case_mask >> i) & 1)
            mask |= tab_run_mask[i];
    }
    for(idx = 0; idx < countof(case_conv_table1); idx++) {
        v = case_conv_table1[idx];
        type = (v >> (32 - 17 - 7 - 4)) & 0xf;
        code = v >> (32 - 17);
        len = (v >> (32 - 17 - 7)) & 0x7f;
        if ((mask >> type) & 1) {
            //            printf("%d: type=%d %04x %04x\n", idx, type, code, code + len - 1);
            switch(type) {
            case RUN_TYPE_UL:
                if ((case_mask & CASE_U) && (case_mask & (CASE_L | CASE_F)))
                    goto def_case;
                code += ((case_mask & CASE_U) != 0);
                for(i = 0; i < len; i += 2) {
                    if (cr_add_interval(cr, code + i, code + i + 1))
                        return -1;
                }
                break;
            case RUN_TYPE_LSU:
                if ((case_mask & CASE_U) && (case_mask & (CASE_L | CASE_F)))
                    goto def_case;
                if (!(case_mask & CASE_U)) {
                    if (cr_add_interval(cr, code, code + 1))
                        return -1;
                }
                if (cr_add_interval(cr, code + 1, code + 2))
                    return -1;
                if (case_mask & CASE_U) {
                    if (cr_add_interval(cr, code + 2, code + 3))
                        return -1;
                }
                break;
            default:
            def_case:
                if (cr_add_interval(cr, code, code + len))
                    return -1;
                break;
            }
        }
    }
    return 0;
}